

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

uint32_t cpu_ldl_data_ra_s390x(CPUArchState_conflict29 *env,target_ulong ptr,uintptr_t retaddr)

{
  int mmu_idx;
  uint32_t uVar1;
  
  mmu_idx = cpu_mmu_index(env,false);
  uVar1 = cpu_ldl_mmuidx_ra_s390x(env,ptr,mmu_idx,retaddr);
  return uVar1;
}

Assistant:

uint32_t cpu_ldl_data_ra(CPUArchState *env, target_ulong ptr, uintptr_t retaddr)
{
    return cpu_ldl_mmuidx_ra(env, ptr, cpu_mmu_index(env, false), retaddr);
}